

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O1

int testKNNValidatorNoK(void)

{
  bool bVar1;
  TypeUnion TVar2;
  ostream *poVar3;
  Model m1;
  Result res;
  Model MStack_68;
  Result local_38;
  
  CoreML::Specification::Model::Model(&MStack_68);
  CoreML::KNNValidatorTests::generateInterface(&MStack_68);
  if (MStack_68._oneof_case_[0] != 0x194) {
    CoreML::Specification::Model::clear_Type(&MStack_68);
    MStack_68._oneof_case_[0] = 0x194;
    TVar2.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x48);
    CoreML::Specification::KNearestNeighborsClassifier::KNearestNeighborsClassifier
              (TVar2.knearestneighborsclassifier_);
    MStack_68.Type_.pipelineclassifier_ = TVar2.pipelineclassifier_;
  }
  TVar2 = MStack_68.Type_;
  CoreML::KNNValidatorTests::addDataPoints(MStack_68.Type_.knearestneighborsclassifier_);
  CoreML::KNNValidatorTests::addStringLabels(TVar2.knearestneighborsclassifier_);
  CoreML::validate<(MLModelType)404>(&local_38,&MStack_68);
  bVar1 = CoreML::Result::good(&local_38);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
               ,0x6d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x97);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.m_message._M_dataplus._M_p != &local_38.m_message.field_2) {
    operator_delete(local_38.m_message._M_dataplus._M_p,
                    local_38.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&MStack_68);
  return (uint)bVar1;
}

Assistant:

int testKNNValidatorNoK() {

    Specification::Model m1;

    KNNValidatorTests::generateInterface(m1);

    auto *nnModel = m1.mutable_knearestneighborsclassifier();

    KNNValidatorTests::addDataPoints(nnModel);
    KNNValidatorTests::addStringLabels(nnModel);

    Result res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    return 0;

}